

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

bool duckdb::DecimalToStringCast<long>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  uint8_t uVar1;
  DecimalCastInput input;
  Vector *local_38;
  uint8_t local_30;
  uint8_t local_2f;
  
  uVar1 = DecimalType::GetWidth(&source->type);
  local_2f = DecimalType::GetScale(&source->type);
  local_38 = result;
  local_30 = uVar1;
  UnaryExecutor::
  ExecuteStandard<long,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::StringCastFromDecimalOperator>
            (source,result,count,&local_38,false,CAN_THROW_RUNTIME_ERROR);
  return true;
}

Assistant:

static bool DecimalToStringCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &source_type = source.GetType();
	auto width = DecimalType::GetWidth(source_type);
	auto scale = DecimalType::GetScale(source_type);
	DecimalCastInput input(result, width, scale);

	UnaryExecutor::GenericExecute<SRC, string_t, StringCastFromDecimalOperator>(source, result, count, (void *)&input);
	return true;
}